

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

CMConnection INT_CMget_indexed_conn(CManager_conflict cm,int i)

{
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  CMTraceType in_ESI;
  CManager in_RDI;
  timespec ts_1;
  timespec ts;
  timespec local_38;
  timespec local_28;
  
  if ((-1 < (int)in_ESI) && ((int)in_ESI < in_RDI->connection_count)) {
    if (in_RDI->connections[(int)in_ESI] != (CMConnection_conflict)0x0) {
      return in_RDI->connections[(int)in_ESI];
    }
    if (in_RDI->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(in_RDI,in_ESI);
      if (iVar2 == 0) goto LAB_0011ca16;
    }
    else if (CMtrace_val[2] == 0) goto LAB_0011ca16;
    if (CMtrace_PID != 0) {
      pFVar1 = (FILE *)in_RDI->CMTrace_file;
      _Var3 = getpid();
      pVar4 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_28);
      fprintf((FILE *)in_RDI->CMTrace_file,"%lld.%.9ld - ",local_28.tv_sec,local_28.tv_nsec);
    }
    fprintf((FILE *)in_RDI->CMTrace_file,"cm->connection[%d] is NULL. INT_CMget_indexed_conn\n",
            (ulong)in_ESI);
LAB_0011ca16:
    fflush((FILE *)in_RDI->CMTrace_file);
    return (CMConnection)0x0;
  }
  if (in_RDI->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(in_RDI,in_ESI);
    if (iVar2 == 0) goto LAB_0011cb1e;
  }
  else if (CMtrace_val[2] == 0) goto LAB_0011cb1e;
  if (CMtrace_PID != 0) {
    pFVar1 = (FILE *)in_RDI->CMTrace_file;
    _Var3 = getpid();
    pVar4 = pthread_self();
    fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_38);
    fprintf((FILE *)in_RDI->CMTrace_file,"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
  }
  fprintf((FILE *)in_RDI->CMTrace_file,"Invalid index. i=%d. INT_CMget_indexed_conn\n",(ulong)in_ESI
         );
LAB_0011cb1e:
  fflush((FILE *)in_RDI->CMTrace_file);
  return (CMConnection)0x0;
}

Assistant:

extern CMConnection 
 INT_CMget_indexed_conn(CManager cm, int i)
 {
     if (i>=0 && i<cm->connection_count) {
	 if (cm->connections[i] != NULL) {
	     return cm->connections[i];
	 } else {
	     CMtrace_out(cm, CMConnectionVerbose,
			 "cm->connection[%d] is NULL. INT_CMget_indexed_conn\n", i);
	     return NULL;
	 }
     } else {
	 CMtrace_out(cm, CMConnectionVerbose,
		     "Invalid index. i=%d. INT_CMget_indexed_conn\n", i);
	 return NULL;
     }
 }